

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::texture::anon_unknown_0::TextureCubeFilteringTestInstance::iterate
          (TestStatus *__return_storage_ptr__,TextureCubeFilteringTestInstance *this)

{
  int green;
  int blue;
  int iVar1;
  deUint32 width;
  deUint32 height;
  TestContext *pTVar2;
  TestLog *this_00;
  reference pvVar3;
  TestTextureCube *pTVar4;
  undefined4 extraout_var;
  MessageBuilder *pMVar5;
  reference pvVar6;
  int *piVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_type sVar8;
  bool local_a49;
  allocator<char> local_9a9;
  string local_9a8;
  int local_988;
  allocator<char> local_981;
  string local_980;
  MessageBuilder local_960;
  TextureCubeView local_7e0;
  ConstPixelBufferAccess local_7a8;
  undefined1 local_779;
  undefined1 local_778 [7];
  bool isOk;
  Vector<int,_3> local_5f4;
  TextureCubeView local_5e8;
  ConstPixelBufferAccess local_5b0;
  undefined1 local_585;
  float local_584;
  undefined1 auStack_580 [3];
  bool isHighQuality;
  int iStack_57c;
  int local_578;
  Vector<int,_3> local_574;
  Vector<float,_4> local_568;
  tcu local_558 [8];
  float afStack_550 [2];
  undefined1 local_548 [8];
  LookupPrecision lookupPrecision;
  LodPrecision lodPrecision;
  Vector<int,_4> local_4fc;
  Vector<int,_4> local_4ec;
  undefined1 local_4dc [8];
  IVec4 colorBits;
  PixelFormat pixelFormat;
  undefined1 local_4b4 [8];
  IVec4 formatBitDepth;
  bool isNearestOnly;
  MessageBuilder local_498;
  undefined1 local_318 [8];
  vector<float,_std::allocator<float>_> texCoord;
  Surface rendered;
  CubeFace local_2e0;
  CubeFace face;
  int faceNdx;
  MessageBuilder local_2d0;
  float local_150 [2];
  Sampler local_148;
  undefined1 local_10c [8];
  ReferenceParams refParams;
  FilterCase *curCase;
  TextureFormatInfo fmtInfo;
  TextureFormat texFmt;
  TestTextureCube *texture;
  TestLog *log;
  TextureCubeFilteringTestInstance *this_local;
  
  pTVar2 = Context::getTestContext((this->super_TestInstance).m_context);
  this_00 = tcu::TestContext::getLog(pTVar2);
  pvVar3 = std::
           vector<vkt::texture::(anonymous_namespace)::TextureCubeFilteringTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeFilteringTestInstance::FilterCase>_>
           ::operator[](&this->m_cases,(long)this->m_caseNdx);
  pTVar4 = util::TextureRenderer::getCubeTexture(&this->m_renderer,pvVar3->textureIndex);
  iVar1 = (*(pTVar4->super_TestTexture)._vptr_TestTexture[0xe])();
  fmtInfo.lookupBias.m_data._8_8_ = *(undefined8 *)CONCAT44(extraout_var,iVar1);
  tcu::getTextureFormatInfo
            ((TextureFormatInfo *)&curCase,(TextureFormat *)(fmtInfo.lookupBias.m_data + 2));
  refParams._140_8_ =
       std::
       vector<vkt::texture::(anonymous_namespace)::TextureCubeFilteringTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeFilteringTestInstance::FilterCase>_>
       ::operator[](&this->m_cases,(long)this->m_caseNdx);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_10c,TEXTURETYPE_CUBE);
  util::createSampler(&local_148,CLAMP_TO_EDGE,CLAMP_TO_EDGE,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.minFilter,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter);
  tcu::Sampler::operator=((Sampler *)(refParams.super_RenderParams.colorBias.m_data + 2),&local_148)
  ;
  refParams.sampler.borderColor.v.uData[2]._0_1_ = 1;
  local_150[0] = fmtInfo.lookupBias.m_data[2];
  local_150[1] = fmtInfo.lookupBias.m_data[3];
  local_10c._4_4_ =
       glu::TextureTestUtil::getSamplerType((TextureFormat)fmtInfo.lookupBias.m_data._8_8_);
  refParams.sampler.seamlessCubeMap = false;
  refParams.sampler._53_3_ = 0;
  refParams.super_RenderParams.colorScale.m_data[2] = fmtInfo.lookupScale.m_data[2];
  refParams.super_RenderParams.colorScale.m_data[3] = fmtInfo.lookupScale.m_data[3];
  refParams.super_RenderParams.colorBias.m_data[0] = fmtInfo.lookupBias.m_data[0];
  refParams.super_RenderParams.colorBias.m_data[1] = fmtInfo.lookupBias.m_data[1];
  refParams.super_RenderParams.bias = fmtInfo.valueMax.m_data[2];
  refParams.super_RenderParams.ref = fmtInfo.valueMax.m_data[3];
  refParams.super_RenderParams.colorScale.m_data[0] = fmtInfo.lookupScale.m_data[0];
  refParams.super_RenderParams.colorScale.m_data[1] = fmtInfo.lookupScale.m_data[1];
  tcu::TestLog::operator<<(&local_2d0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<(&local_2d0,(char (*) [14])"Coordinates: ");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(Vector<float,_2> *)(refParams._140_8_ + 4));
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [5])" -> ");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(Vector<float,_2> *)(refParams._140_8_ + 0xc));
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_2d0);
  local_2e0 = CUBEFACE_NEGATIVE_X;
  do {
    if (5 < (int)local_2e0) {
      this->m_caseNdx = this->m_caseNdx + 1;
      iVar1 = this->m_caseNdx;
      sVar8 = std::
              vector<vkt::texture::(anonymous_namespace)::TextureCubeFilteringTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeFilteringTestInstance::FilterCase>_>
              ::size(&this->m_cases);
      if (iVar1 < (int)sVar8) {
        tcu::TestStatus::incomplete();
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_9a8,"Pass",&local_9a9);
        tcu::TestStatus::pass(__return_storage_ptr__,&local_9a8);
        std::__cxx11::string::~string((string *)&local_9a8);
        std::allocator<char>::~allocator(&local_9a9);
      }
      return __return_storage_ptr__;
    }
    width = util::TextureRenderer::getRenderWidth(&this->m_renderer);
    height = util::TextureRenderer::getRenderHeight(&this->m_renderer);
    tcu::Surface::Surface
              ((Surface *)
               &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,width,height);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)local_318);
    glu::TextureTestUtil::computeQuadTexCoordCube
              ((vector<float,_std::allocator<float>_> *)local_318,local_2e0,
               (Vec2 *)(refParams._140_8_ + 4),(Vec2 *)(refParams._140_8_ + 0xc));
    tcu::TestLog::operator<<(&local_498,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_498,(char (*) [6])"Face ");
    register0x00000000 = getFaceDesc(local_2e0);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char **)(formatBitDepth.m_data + 3));
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_498);
    iVar1 = *(int *)refParams._140_8_;
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_318,0);
    util::TextureRenderer::renderQuad
              (&this->m_renderer,
               (Surface *)
               &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,iVar1,pvVar6,(ReferenceParams *)local_10c)
    ;
    local_a49 = false;
    if ((this->m_testParameters).super_TextureCubeTestCaseParameters.
        super_TextureCommonTestCaseParameters.minFilter == NEAREST) {
      local_a49 = (this->m_testParameters).super_TextureCubeTestCaseParameters.
                  super_TextureCommonTestCaseParameters.magFilter == NEAREST;
    }
    formatBitDepth.m_data[2]._3_1_ = local_a49;
    pixelFormat._8_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
    tcu::getTextureFormatBitDepth((tcu *)local_4b4,(TextureFormat *)&pixelFormat.blueBits);
    piVar7 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_4b4,0);
    iVar1 = *piVar7;
    piVar7 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_4b4,1);
    green = *piVar7;
    piVar7 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_4b4,2);
    blue = *piVar7;
    piVar7 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_4b4,3);
    tcu::PixelFormat::PixelFormat((PixelFormat *)(colorBits.m_data + 2),iVar1,green,blue,*piVar7);
    glu::TextureTestUtil::getBitsVec
              ((TextureTestUtil *)&local_4fc,(PixelFormat *)(colorBits.m_data + 2));
    tcu::operator-((tcu *)&local_4ec,&local_4fc,2 - (formatBitDepth.m_data[2]._3_1_ & 1));
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&lodPrecision.derivateBits,0);
    tcu::max<int,4>((tcu *)local_4dc,&local_4ec,(Vector<int,_4> *)&lodPrecision.derivateBits);
    tcu::LodPrecision::LodPrecision((LodPrecision *)&lookupPrecision.colorMask,RULE_VULKAN);
    tcu::LookupPrecision::LookupPrecision((LookupPrecision *)local_548);
    lodPrecision.rule = 5;
    tcu::computeFixedPointThreshold((tcu *)&local_568,(IVec4 *)local_4dc);
    tcu::operator/(local_558,&local_568,(Vector<float,_4> *)&refParams.super_RenderParams.bias);
    lookupPrecision.uvwBits.m_data._4_8_ = local_558;
    lookupPrecision.colorThreshold.m_data[0] = afStack_550[0];
    lookupPrecision.colorThreshold.m_data[1] = afStack_550[1];
    tcu::Vector<int,_3>::Vector(&local_574,10,10,10);
    lookupPrecision.coordBits.m_data[0] = local_574.m_data[2];
    local_548._0_4_ = local_574.m_data[0];
    local_548._4_4_ = local_574.m_data[1];
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)auStack_580,6,6,0);
    lookupPrecision.uvwBits.m_data[0] = local_578;
    lookupPrecision.coordBits.m_data[1] = _auStack_580;
    lookupPrecision.coordBits.m_data[2] = iStack_57c;
    glu::TextureTestUtil::getCompareMask
              ((TextureTestUtil *)&local_584,(PixelFormat *)(colorBits.m_data + 2));
    lookupPrecision.colorThreshold.m_data[2] = local_584;
    pTVar2 = Context::getTestContext((this->super_TestInstance).m_context);
    tcu::Surface::getAccess
              ((PixelBufferAccess *)&local_5b0,
               (Surface *)
               &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    iVar1 = (*(pTVar4->super_TestTexture)._vptr_TestTexture[0x10])();
    tcu::TextureCube::operator_cast_to_TextureCubeView
              (&local_5e8,(TextureCube *)CONCAT44(extraout_var_00,iVar1));
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_318,0);
    local_585 = glu::TextureTestUtil::verifyTextureResult
                          (pTVar2,&local_5b0,&local_5e8,pvVar6,(ReferenceParams *)local_10c,
                           (LookupPrecision *)local_548,(LodPrecision *)&lookupPrecision.colorMask,
                           (PixelFormat *)(colorBits.m_data + 2));
    if ((bool)local_585) {
LAB_00ec0a87:
      local_988 = 0;
    }
    else {
      lodPrecision.rule = 4;
      tcu::Vector<int,_3>::Vector(&local_5f4,4,4,0);
      lookupPrecision.uvwBits.m_data[0] = local_5f4.m_data[2];
      lookupPrecision.coordBits.m_data[1] = local_5f4.m_data[0];
      lookupPrecision.coordBits.m_data[2] = local_5f4.m_data[1];
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_778,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_778,
                          (char (*) [98])
                          "Warning: Verification against high precision requirements failed, trying with lower requirements."
                         );
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_778);
      pTVar2 = Context::getTestContext((this->super_TestInstance).m_context);
      tcu::Surface::getAccess
                ((PixelBufferAccess *)&local_7a8,
                 (Surface *)
                 &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      iVar1 = (*(pTVar4->super_TestTexture)._vptr_TestTexture[0x10])();
      tcu::TextureCube::operator_cast_to_TextureCubeView
                (&local_7e0,(TextureCube *)CONCAT44(extraout_var_01,iVar1));
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_318,0);
      local_779 = glu::TextureTestUtil::verifyTextureResult
                            (pTVar2,&local_7a8,&local_7e0,pvVar6,(ReferenceParams *)local_10c,
                             (LookupPrecision *)local_548,(LodPrecision *)&lookupPrecision.colorMask
                             ,(PixelFormat *)(colorBits.m_data + 2));
      if ((bool)local_779) goto LAB_00ec0a87;
      tcu::TestLog::operator<<(&local_960,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_960,
                          (char (*) [82])
                          "ERROR: Verification against low precision requirements failed, failing test case."
                         );
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_960);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_980,"Image verification failed",&local_981);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_980);
      std::__cxx11::string::~string((string *)&local_980);
      std::allocator<char>::~allocator(&local_981);
      local_988 = 1;
    }
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)local_318);
    tcu::Surface::~Surface
              ((Surface *)
               &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (local_988 != 0) {
      return __return_storage_ptr__;
    }
    local_2e0 = local_2e0 + CUBEFACE_POSITIVE_X;
  } while( true );
}

Assistant:

tcu::TestStatus TextureCubeFilteringTestInstance::iterate (void)
{
	tcu::TestLog&						log			= m_context.getTestContext().getLog();

	const pipeline::TestTextureCube&	texture		= m_renderer.getCubeTexture(m_cases[m_caseNdx].textureIndex);
	const tcu::TextureFormat			texFmt		= texture.getTextureFormat();
	const tcu::TextureFormatInfo		fmtInfo		= tcu::getTextureFormatInfo(texFmt);
	const FilterCase&					curCase		= m_cases[m_caseNdx];
	ReferenceParams						refParams	(TEXTURETYPE_CUBE);

	// Params for reference computation.
	refParams.sampler					= util::createSampler(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, m_testParameters.minFilter, m_testParameters.magFilter);
	refParams.sampler.seamlessCubeMap	= true;
	refParams.samplerType				= getSamplerType(texFmt);
	refParams.lodMode					= LODMODE_EXACT;
	refParams.colorBias					= fmtInfo.lookupBias;
	refParams.colorScale				= fmtInfo.lookupScale;

	log << TestLog::Message << "Coordinates: " << curCase.bottomLeft << " -> " << curCase.topRight << TestLog::EndMessage;

	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		const tcu::CubeFace		face		= tcu::CubeFace(faceNdx);
		tcu::Surface			rendered	(m_renderer.getRenderWidth(), m_renderer.getRenderHeight());
		vector<float>			texCoord;

		computeQuadTexCoordCube(texCoord, face, curCase.bottomLeft, curCase.topRight);

		log << TestLog::Message << "Face " << getFaceDesc(face) << TestLog::EndMessage;

		// \todo Log texture coordinates.

		m_renderer.renderQuad(rendered, curCase.textureIndex, &texCoord[0], refParams);

		{
			const bool				isNearestOnly	= m_testParameters.minFilter == Sampler::NEAREST && m_testParameters.magFilter == Sampler::NEAREST;
			const tcu::IVec4		formatBitDepth	= getTextureFormatBitDepth(vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM));
			const tcu::PixelFormat	pixelFormat		(formatBitDepth[0], formatBitDepth[1], formatBitDepth[2], formatBitDepth[3]);
			const tcu::IVec4		colorBits		= max(getBitsVec(pixelFormat) - (isNearestOnly ? 1 : 2), tcu::IVec4(0)); // 1 inaccurate bit if nearest only, 2 otherwise
			tcu::LodPrecision		lodPrecision	(tcu::LodPrecision::RULE_VULKAN);
			tcu::LookupPrecision	lookupPrecision;

			lodPrecision.derivateBits		= 10;
			lodPrecision.lodBits			= 5;
			lookupPrecision.colorThreshold	= tcu::computeFixedPointThreshold(colorBits) / refParams.colorScale;
			lookupPrecision.coordBits		= tcu::IVec3(10,10,10);
			lookupPrecision.uvwBits			= tcu::IVec3(6,6,0);
			lookupPrecision.colorMask		= getCompareMask(pixelFormat);

			const bool isHighQuality = verifyTextureResult(m_context.getTestContext(), rendered.getAccess(), (tcu::TextureCubeView)texture.getTexture(),
														   &texCoord[0], refParams, lookupPrecision, lodPrecision, pixelFormat);

			if (!isHighQuality)
			{
				// Evaluate against lower precision requirements.
				lodPrecision.lodBits	= 4;
				lookupPrecision.uvwBits	= tcu::IVec3(4,4,0);

				log << TestLog::Message << "Warning: Verification against high precision requirements failed, trying with lower requirements." << TestLog::EndMessage;

				const bool isOk = verifyTextureResult(m_context.getTestContext(), rendered.getAccess(), (tcu::TextureCubeView)texture.getTexture(),
													  &texCoord[0], refParams, lookupPrecision, lodPrecision, pixelFormat);

				if (!isOk)
				{
					log << TestLog::Message << "ERROR: Verification against low precision requirements failed, failing test case." << TestLog::EndMessage;
					return tcu::TestStatus::fail("Image verification failed");
				}
			}
		}
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? tcu::TestStatus::incomplete() : tcu::TestStatus::pass("Pass");
}